

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int emit_class_init_start(JSParseState *s,ClassFieldsDef *cf)

{
  int label;
  JSFunctionDef *pJVar1;
  int iVar2;
  
  iVar2 = 0;
  pJVar1 = js_new_function_def(s->ctx,s->cur_func,0,0,s->filename,0);
  if (pJVar1 == (JSFunctionDef *)0x0) {
    cf->fields_init_fd = (JSFunctionDef *)0x0;
    iVar2 = -1;
  }
  else {
    pJVar1->func_name = 0;
    pJVar1->has_home_object = 1;
    pJVar1->has_prototype = 0;
    pJVar1->is_derived_class_constructor = 0;
    pJVar1->has_arguments_binding = 0;
    pJVar1->has_this_binding = 1;
    pJVar1->new_target_allowed = 1;
    pJVar1->super_call_allowed = 0;
    pJVar1->super_allowed = 1;
    pJVar1->arguments_allowed = 0;
    *(undefined2 *)&pJVar1->field_0x84 = 0x600;
    cf->fields_init_fd = pJVar1;
    s->cur_func = pJVar1;
    emit_op(s,'\t');
    cf->brand_push_pos = cf->fields_init_fd->last_opcode_pos;
    label = emit_goto(s,0x69,-1);
    emit_op(s,0xb6);
    emit_u32(s,8);
    emit_u16(s,0);
    emit_op(s,0xb6);
    emit_u32(s,0x73);
    emit_u16(s,0);
    emit_op(s,'-');
    emit_label(s,label);
    s->cur_func = s->cur_func->parent;
  }
  return iVar2;
}

Assistant:

static __exception int emit_class_init_start(JSParseState *s,
                                             ClassFieldsDef *cf)
{
    int label_add_brand;
    
    cf->fields_init_fd = js_parse_function_class_fields_init(s);
    if (!cf->fields_init_fd)
        return -1;

    s->cur_func = cf->fields_init_fd;
    
    /* XXX: would be better to add the code only if needed, maybe in a
       later pass */
    emit_op(s, OP_push_false); /* will be patched later */
    cf->brand_push_pos = cf->fields_init_fd->last_opcode_pos;
    label_add_brand = emit_goto(s, OP_if_false, -1);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_this);
    emit_u16(s, 0);
    
    emit_op(s, OP_scope_get_var);
    emit_atom(s, JS_ATOM_home_object);
    emit_u16(s, 0);
    
    emit_op(s, OP_add_brand);
    
    emit_label(s, label_add_brand);

    s->cur_func = s->cur_func->parent;
    return 0;
}